

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_functions.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  ChStreamOutAscii *pCVar3;
  char *__rhs;
  ostream *poVar4;
  undefined8 uVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *this;
  element_type *peVar8;
  element_type *peVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double ydxdx_3;
  double ydx_3;
  double y_3;
  double x_3;
  ChStreamOutAsciiFile local_e98 [4];
  int i_3;
  ChStreamOutAsciiFile file_f_repeat;
  ChStreamOutAscii local_bc8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8 [8];
  string repeatfile;
  shared_ptr<chrono::ChFunction> local_b88;
  undefined1 local_b78 [8];
  shared_ptr<chrono::ChFunction_Repeat> f_rep_seq;
  shared_ptr<chrono::ChFunction> local_b58;
  shared_ptr<chrono::ChFunction> local_b48;
  undefined1 local_b38 [8];
  shared_ptr<chrono::ChFunction_Sequence> f_seq;
  shared_ptr<chrono::ChFunction_Ramp> f_part3;
  shared_ptr<chrono::ChFunction_Const> f_part2;
  shared_ptr<chrono::ChFunction_Ramp> f_part1;
  double ydxdx_2;
  double ydx_2;
  double y_2;
  double x_2;
  ChStreamOutAsciiFile local_ad0 [4];
  int i_2;
  ChStreamOutAsciiFile file_f_sequence;
  ChStreamOutAscii local_800 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0 [8];
  string seqfile;
  shared_ptr<chrono::ChFunction> local_7c0;
  undefined1 local_7b0 [8];
  shared_ptr<chrono::ChFunction_ConstAcc> f_constacc2;
  undefined1 local_790 [8];
  shared_ptr<chrono::ChFunction_Const> f_const;
  undefined1 local_770 [8];
  shared_ptr<chrono::ChFunction_ConstAcc> f_constacc1;
  ChFunction_Sequence f_sequence;
  double ydxdx_1;
  double ydx_1;
  double y_1;
  double x_1;
  ChStreamOutAsciiFile local_710 [4];
  int i_1;
  ChStreamOutAsciiFile file_f_test;
  ChStreamOutAscii local_440 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420 [8];
  string testfile;
  ChFunction_MyTest local_400;
  ChFunction_MyTest f_test;
  double ydxdx;
  double ydx;
  double y;
  double x;
  ChStreamOutAsciiFile local_3d0 [4];
  int i;
  ChStreamOutAsciiFile file_f_sine;
  ChStreamOutAscii local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [8];
  string sinefile;
  ChFunction_Sine local_c0 [8];
  ChFunction_Sine f_sine;
  double ydx_ramp;
  double y_ramp;
  ChFunction_Ramp f_ramp;
  path local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [8];
  string out_dir;
  char **argv_local;
  int argc_local;
  
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar3,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar3,"\n\n");
  __rhs = (char *)chrono::GetChronoOutputPath_abi_cxx11_();
  std::operator+(local_38,__rhs);
  filesystem::path::path(&local_60,local_38);
  bVar2 = filesystem::create_directory(&local_60);
  filesystem::path::~path(&local_60);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 1...\n\n");
    chrono::ChFunction_Ramp::ChFunction_Ramp((ChFunction_Ramp *)&y_ramp);
    chrono::ChFunction_Ramp::Set_ang((ChFunction_Ramp *)&y_ramp,0.1);
    chrono::ChFunction_Ramp::Set_y0((ChFunction_Ramp *)&y_ramp,0.4);
    dVar10 = chrono::ChFunction_Ramp::Get_y((ChFunction_Ramp *)&y_ramp,10.0);
    dVar11 = chrono::ChFunction_Ramp::Get_y_dx((ChFunction_Ramp *)&y_ramp,10.0);
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar3,"   ChFunction_Ramp at x=0: y=");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar10);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,"  dy/dx=");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar11);
    chrono::ChStreamOutAscii::operator<<(pCVar3,"\n\n");
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 2...\n\n");
    chrono::ChFunction_Sine::ChFunction_Sine(local_c0);
    chrono::ChFunction_Sine::Set_amp(local_c0,2.0);
    chrono::ChFunction_Sine::Set_freq(local_c0,1.5);
    std::operator+(local_e0,(char *)local_38);
    uVar5 = std::__cxx11::string::c_str();
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(local_3d0,uVar5,0x20);
    for (x._4_4_ = 0; x._4_4_ < 100; x._4_4_ = x._4_4_ + 1) {
      dVar10 = (double)x._4_4_ / 50.0;
      dVar11 = (double)chrono::ChFunction_Sine::Get_y(dVar10);
      dVar12 = (double)chrono::ChFunction_Sine::Get_y_dx(dVar10);
      f_test = (ChFunction_MyTest)chrono::ChFunction_Sine::Get_y_dxdx(dVar10);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_100,dVar10);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar11);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar12);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,(double)f_test);
      chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
    }
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 3...\n\n");
    main::ChFunction_MyTest::ChFunction_MyTest(&local_400);
    std::operator+(local_420,(char *)local_38);
    uVar5 = std::__cxx11::string::c_str();
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(local_710,uVar5,0x20);
    for (x_1._4_4_ = 0; x_1._4_4_ < 100; x_1._4_4_ = x_1._4_4_ + 1) {
      dVar10 = (double)x_1._4_4_ / 50.0;
      dVar11 = main::ChFunction_MyTest::Get_y(&local_400,dVar10);
      dVar12 = chrono::ChFunction::Get_y_dx(&local_400.super_ChFunction,dVar10);
      dVar13 = chrono::ChFunction::Get_y_dxdx(&local_400.super_ChFunction,dVar10);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_440,dVar10);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar11);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar12);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar13);
      chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
    }
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 4...\n\n");
    chrono::ChFunction_Sequence::ChFunction_Sequence
              ((ChFunction_Sequence *)
               &f_constacc1.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono_types::make_shared<chrono::ChFunction_ConstAcc,_0>();
    peVar6 = std::
             __shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_770);
    chrono::ChFunction_ConstAcc::Set_end(peVar6,0.5);
    peVar6 = std::
             __shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_770);
    chrono::ChFunction_ConstAcc::Set_h(peVar6,0.3);
    p_Var1 = &f_const.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_ConstAcc,void>
              ((shared_ptr<chrono::ChFunction> *)p_Var1,
               (shared_ptr<chrono::ChFunction_ConstAcc> *)local_770);
    chrono::ChFunction_Sequence::InsertFunct
              (0x3fe0000000000000,0x3ff0000000000000,
               &f_constacc1.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,p_Var1,0,0,0);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr
              ((shared_ptr<chrono::ChFunction> *)
               &f_const.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono_types::make_shared<chrono::ChFunction_Const,_0>();
    p_Var1 = &f_constacc2.
              super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Const,void>
              ((shared_ptr<chrono::ChFunction> *)p_Var1,
               (shared_ptr<chrono::ChFunction_Const> *)local_790);
    chrono::ChFunction_Sequence::InsertFunct
              (0x3fd999999999999a,0x3ff0000000000000,
               &f_constacc1.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,p_Var1,1,0,0,0xffffffff);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr
              ((shared_ptr<chrono::ChFunction> *)
               &f_constacc2.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono_types::make_shared<chrono::ChFunction_ConstAcc,_0>();
    peVar6 = std::
             __shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_7b0);
    chrono::ChFunction_ConstAcc::Set_end(peVar6,0.6);
    peVar6 = std::
             __shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_7b0);
    chrono::ChFunction_ConstAcc::Set_av(peVar6,0.3);
    peVar6 = std::
             __shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_7b0);
    chrono::ChFunction_ConstAcc::Set_aw(peVar6,0.7);
    peVar6 = std::
             __shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_7b0);
    chrono::ChFunction_ConstAcc::Set_h(peVar6,-0.2);
    std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_ConstAcc,void>
              (&local_7c0,(shared_ptr<chrono::ChFunction_ConstAcc> *)local_7b0);
    chrono::ChFunction_Sequence::InsertFunct
              (0x3fe3333333333333,0x3ff0000000000000,
               &f_constacc1.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_7c0,1,0,0,0xffffffff);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_7c0);
    chrono::ChFunction_Sequence::Setup();
    std::operator+(local_7e0,(char *)local_38);
    uVar5 = std::__cxx11::string::c_str();
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(local_ad0,uVar5,0x20);
    for (x_2._4_4_ = 0; x_2._4_4_ < 100; x_2._4_4_ = x_2._4_4_ + 1) {
      dVar10 = (double)x_2._4_4_ / 50.0;
      dVar11 = (double)chrono::ChFunction_Sequence::Get_y(dVar10);
      dVar12 = (double)chrono::ChFunction_Sequence::Get_y_dx(dVar10);
      dVar13 = (double)chrono::ChFunction_Sequence::Get_y_dxdx(dVar10);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_800,dVar10);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar11);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar12);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar13);
      chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
    }
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 5...\n\n");
    chrono_types::make_shared<chrono::ChFunction_Ramp,_0>();
    peVar7 = std::
             __shared_ptr_access<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&f_part2.
                              super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    chrono::ChFunction_Ramp::Set_ang(peVar7,0.5);
    chrono_types::make_shared<chrono::ChFunction_Const,_0>();
    this = std::
           __shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&f_part3.
                          super___shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
    chrono::ChFunction_Const::Set_yconst(this,1.0);
    chrono_types::make_shared<chrono::ChFunction_Ramp,_0>();
    peVar7 = std::
             __shared_ptr_access<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&f_seq.
                              super___shared_ptr<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    chrono::ChFunction_Ramp::Set_ang(peVar7,-0.5);
    chrono_types::make_shared<chrono::ChFunction_Sequence,_0>();
    peVar8 = std::
             __shared_ptr_access<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b38);
    std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Ramp,void>
              (&local_b48,
               (shared_ptr<chrono::ChFunction_Ramp> *)
               &f_part2.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono::ChFunction_Sequence::InsertFunct(0x3ff0000000000000,peVar8,&local_b48,1,0,0,0xffffffff);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_b48);
    peVar8 = std::
             __shared_ptr_access<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b38);
    std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Const,void>
              (&local_b58,
               (shared_ptr<chrono::ChFunction_Const> *)
               &f_part3.super___shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono::ChFunction_Sequence::InsertFunct(0x3ff0000000000000,peVar8,&local_b58,1,0,0,0xffffffff);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_b58);
    peVar8 = std::
             __shared_ptr_access<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b38);
    p_Var1 = &f_rep_seq.super___shared_ptr<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Ramp,void>
              ((shared_ptr<chrono::ChFunction> *)p_Var1,
               (shared_ptr<chrono::ChFunction_Ramp> *)
               &f_seq.super___shared_ptr<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono::ChFunction_Sequence::InsertFunct(0x3ff0000000000000,peVar8,p_Var1,1,0,0,0xffffffff);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr
              ((shared_ptr<chrono::ChFunction> *)
               &f_rep_seq.super___shared_ptr<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono_types::make_shared<chrono::ChFunction_Repeat,_0>();
    peVar9 = std::
             __shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b78);
    std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Sequence,void>
              (&local_b88,(shared_ptr<chrono::ChFunction_Sequence> *)local_b38);
    chrono::ChFunction_Repeat::Set_fa(peVar9,&local_b88);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_b88);
    peVar9 = std::
             __shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b78);
    chrono::ChFunction_Repeat::Set_window_length(peVar9,3.0);
    peVar9 = std::
             __shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b78);
    chrono::ChFunction_Repeat::Set_window_start(peVar9,0.0);
    peVar9 = std::
             __shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b78);
    chrono::ChFunction_Repeat::Set_window_phase(peVar9,3.0);
    std::operator+(local_ba8,(char *)local_38);
    uVar5 = std::__cxx11::string::c_str();
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(local_e98,uVar5,0x20);
    for (x_3._4_4_ = 0; x_3._4_4_ < 1000; x_3._4_4_ = x_3._4_4_ + 1) {
      dVar10 = (double)x_3._4_4_ / 50.0;
      peVar9 = std::
               __shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b78);
      dVar11 = (double)(**(code **)(*(long *)peVar9 + 0x20))(dVar10);
      peVar9 = std::
               __shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b78);
      dVar12 = (double)(**(code **)(*(long *)peVar9 + 0x28))(dVar10);
      peVar9 = std::
               __shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b78);
      dVar13 = (double)(**(code **)(*(long *)peVar9 + 0x30))(dVar10);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_bc8,dVar10);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar11);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar12);
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar13);
      chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
    }
    argv_local._4_4_ = 0;
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(local_e98);
    std::__cxx11::string::~string((string *)local_ba8);
    std::shared_ptr<chrono::ChFunction_Repeat>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_Repeat> *)local_b78);
    std::shared_ptr<chrono::ChFunction_Sequence>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_Sequence> *)local_b38);
    std::shared_ptr<chrono::ChFunction_Ramp>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_Ramp> *)
               &f_seq.super___shared_ptr<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<chrono::ChFunction_Const>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_Const> *)
               &f_part3.super___shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<chrono::ChFunction_Ramp>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_Ramp> *)
               &f_part2.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(local_ad0);
    std::__cxx11::string::~string((string *)local_7e0);
    std::shared_ptr<chrono::ChFunction_ConstAcc>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_ConstAcc> *)local_7b0);
    std::shared_ptr<chrono::ChFunction_Const>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_Const> *)local_790);
    std::shared_ptr<chrono::ChFunction_ConstAcc>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_ConstAcc> *)local_770);
    chrono::ChFunction_Sequence::~ChFunction_Sequence
              ((ChFunction_Sequence *)
               &f_constacc1.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(local_710);
    std::__cxx11::string::~string((string *)local_420);
    main::ChFunction_MyTest::~ChFunction_MyTest(&local_400);
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(local_3d0);
    std::__cxx11::string::~string((string *)local_e0);
    chrono::ChFunction_Sine::~ChFunction_Sine(local_c0);
    chrono::ChFunction_Ramp::~ChFunction_Ramp((ChFunction_Ramp *)&y_ramp);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error creating directory ");
    poVar4 = std::operator<<(poVar4,(string *)local_38);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    // Create (if needed) output directory
    const std::string out_dir = GetChronoOutputPath() + "DEMO_FUNCTIONS";
    if (!filesystem::create_directory(filesystem::path(out_dir))) {
        std::cout << "Error creating directory " << out_dir << std::endl;
        return 1;
    }

    //
    // EXAMPLE 1: create a ramp ChFunction, set properties, evaluate it.
    //

    GetLog() << "==== Test 1...\n\n";

    ChFunction_Ramp f_ramp;

    f_ramp.Set_ang(0.1);  // set angular coefficient;
    f_ramp.Set_y0(0.4);   // set y value for x=0;

    // Evaluate y=f(x) function at a given x value, using Get_y() :
    double y_ramp = f_ramp.Get_y(10);
    // Evaluate derivative df(x)/dx at a given x value, using Get_y_dx() :
    double ydx_ramp = f_ramp.Get_y_dx(10);

    GetLog() << "   ChFunction_Ramp at x=0: y=" << y_ramp << "  dy/dx=" << ydx_ramp << "\n\n";

    //
    // EXAMPLE 2: save values of a sine ChFunction  into a file
    //

    GetLog() << "==== Test 2...\n\n";

    ChFunction_Sine f_sine;

    f_sine.Set_amp(2);     // set amplitude;
    f_sine.Set_freq(1.5);  // set frequency;

    std::string sinefile = out_dir + "/f_sine_out.dat";
    ChStreamOutAsciiFile file_f_sine(sinefile.c_str());

    // Evaluate y=f(x) function along 100 x points, and its derivatives,
    // and save to file (later it can be loaded, for example, in Matlab using the 'load()' command)
    for (int i = 0; i < 100; i++) {
        double x = (double)i / 50.0;
        double y = f_sine.Get_y(x);
        double ydx = f_sine.Get_y_dx(x);
        double ydxdx = f_sine.Get_y_dxdx(x);
        file_f_sine << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    //
    // EXAMPLE 3: use a custom function (see class at the beginning of this file)
    //

    GetLog() << "==== Test 3...\n\n";

    // The following class will be used as an example of how
    // how you can create custom functions based on the ChFunction interface.
    // There is at least one mandatory member function to implement:  Get_y().
    // [Note that the base class implements a default computation of derivatives
    // Get_ydx() and Get_ydxdx() by using a numerical differentiation, however
    // if you know the analytical expression of derivatives, you can override
    // the base Get_ydx() and Get_ydxdx() too, for higher precision.]

    class ChFunction_MyTest : public ChFunction {
      public:
        virtual ChFunction_MyTest* Clone() const override { return new ChFunction_MyTest(); }

        virtual double Get_y(double x) const override { return cos(x); }  // just for test: simple cosine
    };

    ChFunction_MyTest f_test;

    std::string testfile = out_dir + "/f_test_out.dat";
    ChStreamOutAsciiFile file_f_test(testfile.c_str());

    // Evaluate y=f(x) function along 100 x points, and its derivatives,
    // and save to file (later it can be loaded, for example, in Matlab using the 'load()' command)
    for (int i = 0; i < 100; i++) {
        double x = (double)i / 50.0;
        double y = f_test.Get_y(x);
        double ydx = f_test.Get_y_dx(x);
        double ydxdx = f_test.Get_y_dxdx(x);
        file_f_test << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    //
    // EXAMPLE 4: mount some functions in a sequence using ChFunction_Sequence
    //

    GetLog() << "==== Test 4...\n\n";

    ChFunction_Sequence f_sequence;

    auto f_constacc1 = chrono_types::make_shared<ChFunction_ConstAcc>();
    f_constacc1->Set_end(0.5);  // length of ramp
    f_constacc1->Set_h(0.3);    // height of ramp
    f_sequence.InsertFunct(f_constacc1, 0.5, 1, false, false, false, 0);

    auto f_const = chrono_types::make_shared<ChFunction_Const>();
    f_sequence.InsertFunct(f_const, 0.4, 1, true, false, false, -1);

    auto f_constacc2 = chrono_types::make_shared<ChFunction_ConstAcc>();
    f_constacc2->Set_end(0.6);  // length of ramp
    f_constacc2->Set_av(0.3);   // acceleration ends after 30% length
    f_constacc2->Set_aw(0.7);   // deceleration starts after 70% length
    f_constacc2->Set_h(-0.2);   // height of ramp
    f_sequence.InsertFunct(f_constacc2, 0.6, 1, true, false, false, -1);

    f_sequence.Setup();

    std::string seqfile = out_dir + "/f_sequence_out.dat";
    ChStreamOutAsciiFile file_f_sequence(seqfile.c_str());

    // Evaluate y=f(x) function along 100 x points, and its derivatives,
    // and save to file (later it can be loaded, for example, in Matlab using the 'load()' command)
    for (int i = 0; i < 100; i++) {
        double x = (double)i / 50.0;
        double y = f_sequence.Get_y(x);
        double ydx = f_sequence.Get_y_dx(x);
        double ydxdx = f_sequence.Get_y_dxdx(x);
        file_f_sequence << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    //
    // EXAMPLE 5: a repeating sequence
    //

    GetLog() << "==== Test 5...\n\n";

    auto f_part1 = chrono_types::make_shared<ChFunction_Ramp>();
    f_part1->Set_ang(.50);
    auto f_part2 = chrono_types::make_shared<ChFunction_Const>();
    f_part2->Set_yconst(1.0);
    auto f_part3 = chrono_types::make_shared<ChFunction_Ramp>();
    f_part3->Set_ang(-.50);

    auto f_seq = chrono_types::make_shared<ChFunction_Sequence>();
    f_seq->InsertFunct(f_part1, 1.0, 1, true);
    f_seq->InsertFunct(f_part2, 1.0, 1., true);
    f_seq->InsertFunct(f_part3, 1.0, 1., true);

    auto f_rep_seq = chrono_types::make_shared<ChFunction_Repeat>();
    f_rep_seq->Set_fa(f_seq);
    f_rep_seq->Set_window_length(3.0);
    f_rep_seq->Set_window_start(0.0);
    f_rep_seq->Set_window_phase(3.0);

    std::string repeatfile = out_dir + "/f_repeat_out.dat";
    ChStreamOutAsciiFile file_f_repeat(repeatfile.c_str());
    for (int i = 0; i < 1000; i++) {
        double x = (double)i / 50.0;
        double y = f_rep_seq->Get_y(x);
        double ydx = f_rep_seq->Get_y_dx(x);
        double ydxdx = f_rep_seq->Get_y_dxdx(x);
        file_f_repeat << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    return 0;
}